

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O1

void __thiscall duckdb::MiniZStreamWrapper::FlushStream(MiniZStreamWrapper *this)

{
  unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
  *this_00;
  CompressedFile *pCVar1;
  uchar *puVar2;
  _Head_base<0UL,_unsigned_char_*,_false> _Var3;
  uint uVar4;
  int iVar5;
  pointer pmVar6;
  pointer pFVar7;
  InternalException *this_01;
  long val;
  data_ptr_t pdVar8;
  string local_50;
  
  pCVar1 = this->file;
  this_00 = &this->mz_stream_ptr;
  pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
           ::operator->(this_00);
  pmVar6->next_in = (uchar *)0x0;
  pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
           ::operator->(this_00);
  pmVar6->avail_in = 0;
  do {
    puVar2 = (pCVar1->stream_data).out_buff_start;
    val = (long)(pCVar1->stream_data).out_buff.
                super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
          ((pCVar1->stream_data).out_buf_size - (long)puVar2);
    pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
             ::operator->(this_00);
    pmVar6->next_out = puVar2;
    uVar4 = NumericCastImpl<unsigned_int,_long,_false>::Convert(val);
    pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
             ::operator->(this_00);
    pmVar6->avail_out = uVar4;
    iVar5 = duckdb_miniz::mz_deflate
                      ((this_00->
                       super_unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb_miniz::mz_stream_s_*,_std::default_delete<duckdb_miniz::mz_stream_s>_>
                       .super__Head_base<0UL,_duckdb_miniz::mz_stream_s_*,_false>._M_head_impl,4);
    pmVar6 = unique_ptr<duckdb_miniz::mz_stream_s,_std::default_delete<duckdb_miniz::mz_stream_s>,_true>
             ::operator->(this_00);
    pdVar8 = (pCVar1->stream_data).out_buff_start + (val - (ulong)pmVar6->avail_out);
    (pCVar1->stream_data).out_buff_start = pdVar8;
    if ((pCVar1->stream_data).out_buff.
        super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl < pdVar8) {
      pFVar7 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::
               operator->(&this->file->child_handle);
      _Var3._M_head_impl =
           (pCVar1->stream_data).out_buff.
           super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      (*pFVar7->file_system->_vptr_FileSystem[6])
                (pFVar7->file_system,pFVar7,_Var3._M_head_impl,
                 (long)(pCVar1->stream_data).out_buff_start - (long)_Var3._M_head_impl);
      (pCVar1->stream_data).out_buff_start =
           (pCVar1->stream_data).out_buff.
           super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    return;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Failed to compress GZIP block","");
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void MiniZStreamWrapper::FlushStream() const {
	auto &sd = file->stream_data;
	mz_stream_ptr->next_in = nullptr;
	mz_stream_ptr->avail_in = 0;
	while (true) {
		auto output_remaining = (sd.out_buff.get() + sd.out_buf_size) - sd.out_buff_start;
		mz_stream_ptr->next_out = sd.out_buff_start;
		mz_stream_ptr->avail_out = NumericCast<unsigned int>(output_remaining);

		auto res = mz_deflate(mz_stream_ptr.get(), duckdb_miniz::MZ_FINISH);
		sd.out_buff_start += (output_remaining - mz_stream_ptr->avail_out);
		if (sd.out_buff_start > sd.out_buff.get()) {
			file->child_handle->Write(sd.out_buff.get(),
			                          UnsafeNumericCast<idx_t>(sd.out_buff_start - sd.out_buff.get()));
			sd.out_buff_start = sd.out_buff.get();
		}
		if (res == duckdb_miniz::MZ_STREAM_END) {
			break;
		}
		if (res != duckdb_miniz::MZ_OK) {
			throw InternalException("Failed to compress GZIP block");
		}
	}
}